

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestCallback::toApp(TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  bool bVar1;
  DoNotSend *this_01;
  allocator<char> local_e9;
  MsgType msgType;
  PossDupFlag possDupFlag;
  
  if (this->checkForDoNotSend != 0) {
    FIX::Text::Text((Text *)&possDupFlag);
    bVar1 = FIX::FieldMap::getFieldIfSet((FieldMap *)message,(FieldBase *)&possDupFlag);
    if (bVar1) {
      bVar1 = std::operator==(&possDupFlag.super_BoolField.super_FieldBase.m_string,"DoNotSend");
      if (bVar1) {
        this_01 = (DoNotSend *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>((string *)&msgType,"",&local_e9);
        FIX::DoNotSend::DoNotSend(this_01,(string *)&msgType);
        __cxa_throw(this_01,&FIX::DoNotSend::typeinfo,FIX::Exception::~Exception);
      }
    }
    FIX::FieldBase::~FieldBase((FieldBase *)&possDupFlag);
  }
  msgType.super_StringField.super_FieldBase._vptr_FieldBase._0_1_ = 0;
  FIX::PossDupFlag::PossDupFlag(&possDupFlag,(BOOLEAN *)&msgType);
  this_00 = (FieldMap *)(message + 0x70);
  bVar1 = FIX::FieldMap::isSetField(this_00,possDupFlag.super_BoolField.super_FieldBase.m_tag);
  if (bVar1) {
    FIX::FieldMap::getField(this_00,(FieldBase *)&possDupFlag);
  }
  bVar1 = FIX::BoolField::getValue(&possDupFlag.super_BoolField);
  if (bVar1) {
    this->resent = this->resent + 1;
    FIX::Message::operator=(&this->lastResent,message);
  }
  FIX::MsgType::MsgType(&msgType);
  FIX::FieldMap::getField(this_00,(FieldBase *)&msgType);
  if (*msgType.super_StringField.super_FieldBase.m_string._M_dataplus._M_p == 'j') {
    this->toBusinessMessageReject = this->toBusinessMessageReject + 1;
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&msgType);
  FIX::FieldBase::~FieldBase((FieldBase *)&possDupFlag);
  return;
}

Assistant:

EXCEPT( DoNotSend )
  {
    if(checkForDoNotSend) {
      FIX::Text text;
      if(message.getFieldIfSet(text) && text == "DoNotSend") {
        throw DoNotSend();
      }
    }

    PossDupFlag possDupFlag(false);
    if( message.getHeader().isSetField(possDupFlag) )
      message.getHeader().getField( possDupFlag );
    if( possDupFlag ) 
    {
      resent++;
      lastResent = message;
    }

    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'j':
      toBusinessMessageReject++; break;
    }
  }